

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-docstate.c
# Opt level: O0

fy_document_state * fy_document_state_alloc(void)

{
  fy_document_state *fyds;
  
  fyds = (fy_document_state *)malloc(0x58);
  if (fyds == (fy_document_state *)0x0) {
    fyds = (fy_document_state *)0x0;
  }
  else {
    memset(fyds,0,0x58);
    fyds->fyt_vd = (fy_token *)0x0;
    fy_token_list_init(&fyds->fyt_td);
    fyds->refs = 1;
  }
  return fyds;
}

Assistant:

struct fy_document_state *fy_document_state_alloc(void) {
    struct fy_document_state *fyds;

    fyds = malloc(sizeof(*fyds));
    if (!fyds)
        return NULL;
    memset(fyds, 0, sizeof(*fyds));

    fyds->fyt_vd = NULL;
    fy_token_list_init(&fyds->fyt_td);

    fyds->refs = 1;

    return fyds;
}